

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O1

int __thiscall LengauerTarjan::EVAL(LengauerTarjan *this,int v)

{
  if ((this->ancestor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[v] != -1) {
    COMPRESS(this,v);
    v = (this->label).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[v];
  }
  return v;
}

Assistant:

int LengauerTarjan::EVAL(int v) {
	if (ancestor[v] == -1) {
		return v;
	}
	COMPRESS(v);
	return label[v];
}